

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

bool __thiscall LiteScript::Memory::SaveVariable(Memory *this,ostream *stream,uint i)

{
  bool bVar1;
  reference ppvVar2;
  Variable *v_00;
  OStreamer *pOVar3;
  Object *pOVar4;
  Type *pTVar5;
  uint local_7c;
  uchar local_75 [13];
  Nullable<LiteScript::Variable> local_68;
  undefined1 local_48 [8];
  Variable v;
  uint block;
  OStreamer streamer;
  uint i_local;
  ostream *stream_local;
  Memory *this_local;
  
  streamer.stream._4_4_ = i;
  OStreamer::OStreamer((OStreamer *)&stack0xffffffffffffffd0,stream);
  v.nb_ref._4_4_ = streamer.stream._4_4_ >> 0x10;
  ppvVar2 = std::array<void_*,_256UL>::operator[](&this->arr,(ulong)v.nb_ref._4_4_);
  if (*ppvVar2 == (value_type)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ppvVar2 = std::array<void_*,_256UL>::operator[](&this->arr,(ulong)v.nb_ref._4_4_);
    bVar1 = _BasicMemory_1::FlagsProtect((_BasicMemory_1 *)*ppvVar2,streamer.stream._4_4_ & 0xffff);
    if (bVar1) {
      v.nb_ref._3_1_ = 0;
      pOVar3 = OStreamer::operator<<
                         ((OStreamer *)&stack0xffffffffffffffd0,(uchar *)((long)&v.nb_ref + 3));
      OStreamer::operator<<(pOVar3,(uint *)((long)&streamer.stream + 4));
      this_local._7_1_ = true;
    }
    else {
      GetVariable(&local_68,this,streamer.stream._4_4_);
      v_00 = Nullable<LiteScript::Variable>::operator*(&local_68);
      Variable::Variable((Variable *)local_48,v_00);
      Nullable<LiteScript::Variable>::~Nullable(&local_68);
      local_75[0] = '\x01';
      pOVar3 = OStreamer::operator<<((OStreamer *)&stack0xffffffffffffffd0,local_75);
      pOVar4 = Variable::operator->((Variable *)local_48);
      pOVar3 = OStreamer::operator<<(pOVar3,&pOVar4->ID);
      pOVar4 = Variable::operator->((Variable *)local_48);
      pTVar5 = Object::GetType(pOVar4);
      local_7c = Type::GetID(pTVar5);
      OStreamer::operator<<(pOVar3,&local_7c);
      pOVar4 = Variable::operator->((Variable *)local_48);
      pTVar5 = Object::GetType(pOVar4);
      pOVar4 = Variable::operator*((Variable *)local_48);
      (*pTVar5->_vptr_Type[0x26])(pTVar5,stream,pOVar4,SaveVariable,0);
      this_local._7_1_ = false;
      Variable::~Variable((Variable *)local_48);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool LiteScript::Memory::SaveVariable(std::ostream &stream, unsigned int i) {
    OStreamer streamer(stream);
    unsigned int block = i >> 16;
    if (this->arr[block] != nullptr) {
        if (((LiteScript::_BasicMemory_1 *) (this->arr[block]))->FlagsProtect(i & 0xffff)) {
            streamer << (unsigned char)0 << i;
            return true;
        }
        else {
            Variable v = *this->GetVariable(i);
            streamer << (unsigned char)1 << v->ID << v->GetType().GetID();
            v->GetType().Save(stream, *v, &Memory::SaveVariable);
            return false;
        }
    }
    return false;
}